

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfgconv.cpp
# Opt level: O2

void readoptions(int argc,char **argv)

{
  int iVar1;
  istream *piVar2;
  unsigned_long uVar3;
  char *pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  long lVar7;
  ostream *poVar8;
  undefined8 uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  string *this;
  char *pcVar11;
  char *pcVar12;
  value_type local_460 [2];
  string line;
  uint auStack_418 [120];
  ifstream input;
  
  std::ifstream::ifstream((istream *)&input);
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while (iVar1 = getopt(argc,argv,"t:s:r:a:A:i:d:"), pcVar4 = _optarg, iVar1 == 0x41) {
              std::ifstream::ifstream(&line,_optarg,_S_in);
              std::ifstream::operator=((istream *)&input,(ifstream *)&line);
              std::ifstream::~ifstream(&line);
              line._M_dataplus._M_p = (pointer)&line.field_2;
              line._M_string_length = 0;
              line.field_2._M_local_buf[0] = '\0';
              while (piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                        ((istream *)&input,(string *)&line),
                    ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
                trim(&line);
                if ((1 < line._M_string_length) &&
                   (iVar1 = std::__cxx11::string::compare((ulong)&line,0,(char *)0x2), iVar1 != 0))
                {
                  std::__cxx11::string::substr((ulong)local_460,(ulong)&line);
                  std::__cxx11::string::operator=((string *)&line,(string *)local_460);
                  std::__cxx11::string::~string((string *)local_460);
                }
                if ((line._M_string_length != 0) &&
                   (uVar3 = std::__cxx11::stoul(&line,(size_t *)0x0,0x10), uVar3 != 0)) {
                  local_460[0].first = uVar3;
                  local_460[0].second = uVar3;
                  std::__cxx11::
                  list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::push_back(&config.ranges,local_460);
                }
              }
              std::__cxx11::string::~string((string *)&line);
              std::ifstream::close();
            }
            if (iVar1 != 0x61) break;
            iVar1 = strncasecmp(_optarg,"0x",2);
            if (iVar1 != 0) {
              pcVar4 = pcVar4 + 2;
              _optarg = pcVar4;
            }
            std::__cxx11::string::string((string *)&line,pcVar4,(allocator *)local_460);
            pcVar5 = (pointer)std::__cxx11::stoul(&line,(size_t *)0x0,0x10);
            std::__cxx11::string::~string((string *)&line);
            if (pcVar5 != (pointer)0x0) {
              line._M_dataplus._M_p = pcVar5;
              line._M_string_length = (size_type)pcVar5;
              std::__cxx11::
              list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::push_back(&config.ranges,(value_type *)&line);
            }
          }
          if (iVar1 != 100) break;
          config.dump = _optarg;
        }
        if (iVar1 != 0x69) break;
        config.instrs = _optarg;
      }
      if (iVar1 == 0x72) break;
      if (iVar1 == 0x73) {
        iVar1 = strcasecmp(_optarg,"all");
        if (iVar1 == 0) {
          config.show = SHOW_ALL;
        }
        else {
          iVar1 = strcasecmp(pcVar4,"valid");
          if (iVar1 == 0) {
            config.show = BFTRACE_TYPE;
          }
          else {
            iVar1 = strcasecmp(pcVar4,"invalid");
            if (iVar1 != 0) {
              pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              std::__cxx11::string::string((string *)&line,"invalid show: ",(allocator *)local_460);
              std::operator+(pbVar10,&line,_optarg);
              __cxa_throw(pbVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            config.show = CFGGRIND_TYPE;
          }
        }
      }
      else {
        if (iVar1 != 0x74) {
          if (iVar1 != -1) {
            pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            std::__cxx11::string::string((string *)&line,"Invalid option: ",(allocator *)local_460);
            std::operator+(pbVar10,&line,optopt);
            __cxa_throw(pbVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          lVar7 = (long)_optind;
          if (_optind < argc) {
            _optind = _optind + 1;
            config.input = argv[lVar7];
            if (argc <= _optind) {
              if (config.type == SHOW_ALL) {
                this = (string *)__cxa_allocate_exception(0x20);
                std::__cxx11::string::string(this,"-t option is mandatory",(allocator *)&line);
                __cxa_throw(this,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
              }
              std::ifstream::~ifstream(&input);
              return;
            }
          }
          else {
            usage(*argv);
          }
          pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __cxa_allocate_exception(0x20);
          std::__cxx11::string::string
                    ((string *)&line,"Unknown extra option: ",(allocator *)local_460);
          std::operator+(pbVar10,&line,argv[_optind]);
          __cxa_throw(pbVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        iVar1 = strcasecmp(_optarg,"bftrace");
        if (iVar1 == 0) {
          config.type = BFTRACE_TYPE;
        }
        else {
          iVar1 = strcasecmp(pcVar4,"cfggrind");
          if (iVar1 == 0) {
            config.type = CFGGRIND_TYPE;
          }
          else {
            iVar1 = strcasecmp(pcVar4,"dcfg");
            if (iVar1 != 0) {
              pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              std::__cxx11::string::string((string *)&line,"invalid type: ",(allocator *)local_460);
              std::operator+(pbVar10,&line,_optarg);
              __cxa_throw(pbVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            config.type = DCFG_TYPE;
          }
        }
      }
    }
    pcVar4 = strchr(_optarg,0x3a);
    if (pcVar4 == (char *)0x0) {
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __cxa_allocate_exception(0x20);
      std::__cxx11::string::string((string *)&line,"invalid range: ",(allocator *)local_460);
      std::operator+(pbVar10,&line,_optarg);
      __cxa_throw(pbVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    *pcVar4 = '\0';
    pcVar12 = _optarg;
    iVar1 = strncasecmp(_optarg,"0x",2);
    if (iVar1 != 0) {
      pcVar12 = pcVar12 + 2;
      _optarg = pcVar12;
    }
    iVar1 = strncasecmp(pcVar4 + 1,"0x",2);
    pcVar11 = pcVar4 + 3;
    if (iVar1 == 0) {
      pcVar11 = pcVar4 + 1;
    }
    std::__cxx11::string::string((string *)&line,pcVar12,(allocator *)local_460);
    pcVar5 = (pointer)std::__cxx11::stoul(&line,(size_t *)0x0,0x10);
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::string::string((string *)&line,pcVar11,(allocator *)local_460);
    pcVar6 = (pointer)std::__cxx11::stoul(&line,(size_t *)0x0,0x10);
    std::__cxx11::string::~string((string *)&line);
    if (pcVar6 < pcVar5) break;
    line._M_dataplus._M_p = pcVar5;
    line._M_string_length = (size_type)pcVar6;
    std::__cxx11::
    list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::push_back(&config.ranges,(value_type *)&line);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&line);
  lVar7 = *(long *)(CONCAT71(line.field_2._M_allocated_capacity._1_7_,line.field_2._M_local_buf[0])
                   + -0x18);
  *(uint *)((long)auStack_418 + lVar7) = *(uint *)((long)auStack_418 + lVar7) & 0xffffffb5 | 8;
  poVar8 = std::operator<<((ostream *)line.field_2._M_local_buf,"invalid range: ");
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  poVar8 = std::operator<<(poVar8," < ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  uVar9 = __cxa_allocate_exception(0x20);
  std::__cxx11::stringbuf::str();
  __cxa_throw(uVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void readoptions(int argc, char* argv[]) {
	int opt;
	char* idx;
	Addr start, end;
	std::ifstream input;

	while ((opt = getopt(argc, argv, "t:s:r:a:A:i:d:")) != -1) {
		switch (opt) {
			case 't':
				if (strcasecmp(optarg, "bftrace") == 0)
					config.type = Config::BFTRACE_TYPE;
				else if (strcasecmp(optarg, "cfggrind") == 0)
					config.type = Config::CFGGRIND_TYPE;
				else if (strcasecmp(optarg, "dcfg") == 0)
					config.type = Config::DCFG_TYPE;
				else
					throw std::string("invalid type: ") + optarg;

				break;
			case 's':
				if (strcasecmp(optarg, "all") == 0)
					config.show = Config::SHOW_ALL;
				else if (strcasecmp(optarg, "valid") == 0)
					config.show = Config::SHOW_VALID_ONLY;
				else if (strcasecmp(optarg, "invalid") == 0)
					config.show = Config::SHOW_INVALID_ONLY;
				else
					throw std::string("invalid show: ") + optarg;

				break;
			case 'r':
				idx = strchr(optarg, ':');
				if (!idx)
					throw std::string("invalid range: ") + optarg;

				*idx = 0;
				idx++;

				if (strncasecmp(optarg, "0x", 2))
					optarg += 2;
				if (strncasecmp(idx, "0x", 2))
					idx += 2;

				start = std::stoul(optarg, 0, 16);
				end = std::stoul(idx, 0, 16);

				if (end < start) {
					std::stringstream ss;
					ss << std::hex;
					ss << "invalid range: " << end << " < " << start;

					throw ss.str();
				}

				config.ranges.push_back(std::make_pair(start, end));
				break;
			case 'a':
				if (strncasecmp(optarg, "0x", 2))
					optarg += 2;

				start = std::stoul(optarg, 0, 16);
				if (start != 0)
					config.ranges.push_back(std::make_pair(start, start));
				break;
			case 'A':
				input = std::ifstream(optarg);
				for (std::string line; getline(input, line); ) {
					trim(line);

					if (line.length() >= 2 && line.compare(0, 2, "0x"))
						line = line.substr(2);

					if (line.empty())
						continue;

					start = std::stoul(line, 0, 16);
					if (start != 0)
						config.ranges.push_back(std::make_pair(start, start));
				}
				input.close();

				break;
			case 'i':
				config.instrs = optarg;
				break;
			case 'd':
				config.dump = optarg;
				break;
			default:
				throw std::string("Invalid option: ") + (char) optopt;
		}
	}

	if (optind >= argc)
		usage(argv[0]);

	config.input = argv[optind++];

	if (optind < argc)
		throw std::string("Unknown extra option: ") + argv[optind];

	if (config.type == Config::UNDEF_TYPE)
		throw std::string("-t option is mandatory");
}